

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

int cpu_memory_rw_debug_mipsel
              (CPUState *cpu,target_ulong_conflict addr,void *ptr,target_ulong_conflict len,
              _Bool is_write)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var2;
  AddressSpace *as;
  CPUState *pCVar3;
  uint uVar4;
  hwaddr hVar5;
  undefined7 in_register_00000081;
  uint uVar6;
  uint uVar7;
  ulong len_00;
  MemTxAttrs attrs;
  MemTxAttrs in_stack_ffffffffffffffb8;
  MemTxAttrs local_40;
  undefined4 local_3c;
  CPUState *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000081,is_write);
  local_38 = cpu;
  if (len != 0) {
    do {
      pCVar3 = local_38;
      uVar6 = addr & 0xfffff000;
      p_Var1 = local_38->cc->get_phys_page_attrs_debug;
      if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
        local_40 = (MemTxAttrs)0x1;
        hVar5 = (*local_38->cc->get_phys_page_debug)((CPUState_conflict *)local_38,(ulong)uVar6);
      }
      else {
        hVar5 = (*p_Var1)((CPUState_conflict *)local_38,(ulong)uVar6,&local_40);
      }
      p_Var2 = pCVar3->cc->asidx_from_attrs;
      if (p_Var2 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (*p_Var2)((CPUState_conflict *)pCVar3,in_stack_ffffffffffffffb8);
        if (((int)uVar4 < 0) || (pCVar3->num_ases <= (int)uVar4)) {
          __assert_fail("ret < cpu->num_ases && ret >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                        ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
        }
      }
      if (hVar5 == 0xffffffffffffffff) {
        return -1;
      }
      uVar7 = (uVar6 + 0x1000) - addr;
      if (len <= uVar7) {
        uVar7 = len;
      }
      len_00 = (ulong)uVar7;
      hVar5 = hVar5 + (addr & 0xfff);
      as = pCVar3->cpu_ases[uVar4].as;
      if ((char)local_3c == '\0') {
        if (uVar6 + 0x1000 != addr) {
          flatview_read((uc_struct_conflict5 *)as->uc,as->current_map,hVar5,local_40,ptr,len_00);
        }
      }
      else {
        address_space_write_rom_mipsel(as,hVar5,local_40,ptr,len_00);
      }
      ptr = (void *)((long)ptr + len_00);
      addr = addr + uVar7;
      len = len - uVar7;
    } while (len != 0);
  }
  return 0;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}